

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O1

LogicalDependencyList *
duckdb::LogicalDependencyList::Deserialize
          (LogicalDependencyList *__return_storage_ptr__,Deserializer *deserializer)

{
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_48;
  
  (__return_storage_ptr__->set)._M_h._M_buckets =
       &(__return_storage_ptr__->set)._M_h._M_single_bucket;
  (__return_storage_ptr__->set)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->set)._M_h._M_element_count = 0;
  (__return_storage_ptr__->set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->set)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"set");
  Deserializer::
  Read<std::unordered_set<duckdb::LogicalDependency,duckdb::LogicalDependencyHashFunction,duckdb::LogicalDependencyEquality,std::allocator<duckdb::LogicalDependency>>>
            ((type *)&_Stack_48,deserializer);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_move_assign((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)__return_storage_ptr__,&_Stack_48);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_48);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return __return_storage_ptr__;
}

Assistant:

LogicalDependencyList LogicalDependencyList::Deserialize(Deserializer &deserializer) {
	LogicalDependencyList result;
	deserializer.ReadProperty<create_info_set_t>(100, "set", result.set);
	return result;
}